

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn.cpp
# Opt level: O3

void asn1::dumpDER(MemBuffer *mb,int level,int offset)

{
  byte *pbVar1;
  ushort *puVar2;
  pair<int,_int> pVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long lVar5;
  pointer puVar6;
  uint uVar7;
  undefined8 *puVar8;
  char *pcVar9;
  int size;
  ulong uVar10;
  size_t __n;
  uint uVar11;
  char local_f8 [8];
  char spaces [70];
  undefined1 local_a8 [8];
  uint t;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  MemBuffer local_88;
  int local_60;
  int local_5c;
  undefined1 local_58 [8];
  MemBuffer mb2;
  
  puVar8 = &DAT_00190740;
  pcVar9 = local_f8;
  local_60 = offset;
  for (lVar5 = 8; lVar5 != 0; lVar5 = lVar5 + -1) {
    *(undefined8 *)pcVar9 = *puVar8;
    puVar8 = puVar8 + 1;
    pcVar9 = pcVar9 + 8;
  }
  builtin_strncpy(spaces + 0x38,"     ",6);
  mb2.readpos._4_4_ = level;
  spaces[(long)level * 4 + -8] = '\0';
  uVar10 = mb->readpos;
  if (uVar10 < (ulong)((long)(mb->data).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(mb->data).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start)) {
    mb2.readpos._4_4_ = mb2.readpos._4_4_ + 1;
    do {
      uVar7 = (int)uVar10 + local_60;
      pVar3 = MemBuffer::readDERHead(mb);
      uVar10 = (ulong)pVar3 >> 0x20;
      local_5c = (int)mb->readpos;
      size = pVar3.second;
      MemBuffer::readBuffer((MemBuffer *)local_58,mb,size);
      uVar11 = pVar3.first;
      printf("%04x : %s%02x %04x : ",(ulong)uVar7,local_f8,(ulong)pVar3 & 0xffffffff,uVar10);
      if ((uVar11 & 0xfffffffb) == 0x13) {
        MemBuffer::readString_abi_cxx11_((string *)local_a8,(MemBuffer *)local_58,size);
        printf("\"%s\" \n",CONCAT44(local_a8._4_4_,local_a8._0_4_));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_a8._4_4_,local_a8._0_4_) != &local_98) {
          uVar10 = local_98._M_allocated_capacity + 1;
          paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
LAB_00172d29:
          operator_delete(paVar4,uVar10);
        }
      }
      else if ((uVar11 - 3 < 2) || (uVar11 == 6)) {
        if (size != 0 && -1 < (long)pVar3) {
          do {
            pbVar1 = (byte *)((long)local_58 +
                             (long)mb2.data.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
            mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 1;
            printf("%02x ",(ulong)*pbVar1);
            uVar7 = (int)uVar10 - 1;
            uVar10 = (ulong)uVar7;
          } while (uVar7 != 0);
        }
        putchar(10);
      }
      else if (uVar11 == 2) {
        if (size == 4) {
          puVar6 = (pointer)((long)local_58 +
                            (long)mb2.data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage) + 3;
          lVar5 = 0;
          do {
            local_a8[lVar5] = *puVar6;
            lVar5 = lVar5 + 1;
            puVar6 = puVar6 + -1;
          } while (lVar5 != 4);
          mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 4;
          uVar10 = (ulong)(uint)local_a8._0_4_;
        }
        else if (size == 2) {
          puVar2 = (ushort *)
                   ((long)local_58 +
                   (long)mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
          mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 2;
          uVar10 = (ulong)(ushort)(*puVar2 << 8 | *puVar2 >> 8);
        }
        else {
          uVar10 = 0;
          if (size == 1) {
            uVar10 = (ulong)*(byte *)((long)local_58 +
                                     (long)mb2.data.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
            mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 1;
          }
        }
        printf("%x\n",uVar10);
      }
      else if ((int)uVar11 < 0x30) {
        if (uVar11 == 5) {
          pcVar9 = "NULL";
        }
        else {
          pcVar9 = "<data>";
        }
        puts(pcVar9);
      }
      else {
        putchar(10);
        local_88.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_88.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar10 = (long)mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start - (long)local_58;
        if (uVar10 == 0) {
          paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
          __n = 0;
        }
        else {
          if ((long)uVar10 < 0) {
            std::__throw_bad_alloc();
          }
          paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)operator_new(uVar10);
          __n = (long)mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start - (long)local_58;
        }
        local_88.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(paVar4->_M_local_buf + uVar10);
        local_88.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)paVar4;
        if ((undefined1  [8])
            mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != local_58) {
          local_88.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)paVar4;
          memmove(paVar4,(void *)local_58,__n);
        }
        local_88.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)(paVar4->_M_local_buf + __n);
        local_88.readpos =
             (uint64_t)
             mb2.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        dumpDER(&local_88,mb2.readpos._4_4_,local_5c);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          uVar10 = (long)local_88.data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage -
                   (long)local_88.data.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
          paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_88.data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
          goto LAB_00172d29;
        }
      }
      if (local_58 != (undefined1  [8])0x0) {
        operator_delete((void *)local_58,
                        (long)mb2.data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)local_58);
      }
      uVar10 = mb->readpos;
    } while (uVar10 < (ulong)((long)(mb->data).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(mb->data).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start));
  }
  return;
}

Assistant:

void dumpDER(MemBuffer mb, int level, int offset)
{
    char spaces[] =
        "                                                                     ";
    spaces[level * 4] = 0;
    while (!mb.done()) {
        unsigned int offs = mb.pos() + offset;
        auto p = mb.readDERHead();
        int o = mb.pos();
        MemBuffer mb2 = mb.readBuffer(p.second);
        printf("%04x : %s%02x %04x : ", offs, spaces, p.first, p.second);

        if (p.first == 0x13 || p.first == 0x17) {
            printf("\"%s\" \n", mb2.readString(p.second).c_str());
        } else if (p.first == 0x02) {
            unsigned v = 0;
            switch (p.second) {
            case 1:
                v = mb2.read<uint8_t>();
                break;
            case 2:
                v = mb2.read<uint16_t>();
                break;
            case 4:
                v = mb2.read<uint32_t>();
                break;
            }
            printf("%x\n", v);
        } else if (p.first == 03 || p.first == 4 || p.first == 6) {
            for (int i = 0; i < p.second; i++)
                printf("%02x ", mb2.read<uint8_t>());
            printf("\n");
        } else if (p.first >= 0x30) {
            printf("\n");
            dumpDER(mb2, level + 1, o);
        } else if (p.first == 5)
            printf("NULL\n");
        else
            printf("<data>\n");
    }
}